

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O1

void base_edata_heap_insert(tsdn_t *tsdn,base_t *base,edata_t *edata)

{
  ulong size;
  uint uVar1;
  
  size = *(long *)&base->ehooks_base + 1;
  if (size < 0x1001) {
    uVar1 = (uint)duckdb_je_sz_size2index_tab[*(long *)&base->ehooks_base + 8U >> 3];
  }
  else {
    uVar1 = sz_size2index_compute(size);
  }
  duckdb_je_edata_heap_insert
            ((edata_heap_t *)
             ((tsdn->tsd).cant_access_tsd_items_directly_use_a_getter_or_setter_binshards.binshard +
             (ulong)(uVar1 - 1) * 0x10 + 7),(edata_t *)base);
  return;
}

Assistant:

static void
base_edata_heap_insert(tsdn_t *tsdn, base_t *base, edata_t *edata) {
	malloc_mutex_assert_owner(tsdn, &base->mtx);

	size_t bsize = edata_bsize_get(edata);
	assert(bsize > 0);
	/*
	 * Compute the index for the largest size class that does not exceed
	 * extent's size.
	 */
	szind_t index_floor = sz_size2index(bsize + 1) - 1;
	edata_heap_insert(&base->avail[index_floor], edata);
}